

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void u_slow_down(void)

{
  u.uprops[0x1a].intrinsic = 0;
  if (u.uprops[0x1a].extrinsic == 0) {
    pline("You slow down.");
  }
  else {
    pline("Your quickness feels less natural.");
  }
  exercise(3,'\0');
  return;
}

Assistant:

void u_slow_down(void)
{
	HFast = 0L;
	if (!Fast)
	    pline("You slow down.");
	else	/* speed boots */
	    pline("Your quickness feels less natural.");
	exercise(A_DEX, FALSE);
}